

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O0

Span * __thiscall tcmalloc::PageHeap::NewLocked(PageHeap *this,Length n,LockingContext *context)

{
  bool bVar1;
  Length n_00;
  Span *pSVar2;
  int *piVar3;
  Span *result;
  LockingContext *context_local;
  Length n_local;
  PageHeap *this_local;
  
  n_00 = RoundUpSize(this,n);
  this_local = (PageHeap *)SearchFreeAndLargeLists(this,n_00);
  if (this_local == (PageHeap *)0x0) {
    if (((((this->stats_).free_bytes != 0) && ((this->stats_).unmapped_bytes != 0)) &&
        ((this->stats_).system_bytes >> 2 <=
         (this->stats_).free_bytes + (this->stats_).unmapped_bytes)) &&
       ((this->stats_).system_bytes >> 0x1b != (this->stats_).system_bytes + n_00 * 0x2000 >> 0x1b))
    {
      ReleaseAtLeastNPages(this,0x7fffffff);
      pSVar2 = SearchFreeAndLargeLists(this,n_00);
      if (pSVar2 != (Span *)0x0) {
        return pSVar2;
      }
    }
    bVar1 = GrowHeap(this,n_00,context);
    if (bVar1) {
      this_local = (PageHeap *)SearchFreeAndLargeLists(this,n_00);
    }
    else {
      piVar3 = __errno_location();
      *piVar3 = 0xc;
      this_local = (PageHeap *)0x0;
    }
  }
  return (Span *)this_local;
}

Assistant:

Span* PageHeap::NewLocked(Length n, LockingContext* context) {
  ASSERT(lock_.IsHeld());
  ASSERT(Check());
  n = RoundUpSize(n);

  Span* result = SearchFreeAndLargeLists(n);
  if (result != nullptr)
    return result;

  if (stats_.free_bytes != 0 && stats_.unmapped_bytes != 0
      && stats_.free_bytes + stats_.unmapped_bytes >= stats_.system_bytes / 4
      && (stats_.system_bytes / kForcedCoalesceInterval
          != (stats_.system_bytes + (n << kPageShift)) / kForcedCoalesceInterval)) {
    // We're about to grow heap, but there are lots of free pages.
    // tcmalloc's design decision to keep unmapped and free spans
    // separately and never coalesce them means that sometimes there
    // can be free pages span of sufficient size, but it consists of
    // "segments" of different type so page heap search cannot find
    // it. In order to prevent growing heap and wasting memory in such
    // case we're going to unmap all free pages. So that all free
    // spans are maximally coalesced.
    //
    // We're also limiting 'rate' of going into this path to be at
    // most once per 128 megs of heap growth. Otherwise programs that
    // grow heap frequently (and that means by small amount) could be
    // penalized with higher count of minor page faults.
    //
    // See also large_heap_fragmentation_unittest.cc and
    // https://github.com/gperftools/gperftools/issues/371
    ReleaseAtLeastNPages(static_cast<Length>(0x7fffffff));

    // then try again. If we are forced to grow heap because of large
    // spans fragmentation and not because of problem described above,
    // then at the very least we've just unmapped free but
    // insufficiently big large spans back to OS. So in case of really
    // unlucky memory fragmentation we'll be consuming virtual address
    // space, but not real memory
    result = SearchFreeAndLargeLists(n);
    if (result != nullptr) return result;
  }

  // Grow the heap and try again.
  if (!GrowHeap(n, context)) {
    ASSERT(stats_.unmapped_bytes+ stats_.committed_bytes==stats_.system_bytes);
    ASSERT(Check());
    // underlying SysAllocator likely set ENOMEM but we can get here
    // due to EnsureLimit so we set it here too.
    //
    // Setting errno to ENOMEM here allows us to avoid dealing with it
    // in fast-path.
    errno = ENOMEM;
    return nullptr;
  }
  return SearchFreeAndLargeLists(n);
}